

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

void __thiscall
spvtools::val::ValidationState_t::RegisterStorageClassConsumer
          (ValidationState_t *this,StorageClass storage_class,Instruction *consumer)

{
  bool bVar1;
  Function *pFVar2;
  code *pcVar3;
  char *in_RCX;
  uint *puVar4;
  _Any_data *p_Var5;
  undefined1 *local_198;
  long local_190;
  undefined1 local_188;
  undefined7 uStack_187;
  long lStack_180;
  string errorVUID;
  _Any_data local_158;
  code *local_148;
  code *local_140;
  _Any_data local_138;
  code *local_128;
  code *local_120;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  bVar1 = spvIsVulkanEnv(this->context_->target_env);
  if (!bVar1) {
    puVar4 = &switchD_001d19eb::switchdataD_0036de7c;
    switch(storage_class) {
    case RayPayloadKHR:
      goto switchD_001d19fb_caseD_14da;
    case HitAttributeKHR:
      goto switchD_001d19fb_caseD_14db;
    case CallableDataKHR|StorageBuffer:
    case CallableDataKHR|StorageBuffer|Input:
      goto switchD_001d19fb_caseD_14dc;
    case IncomingRayPayloadKHR:
      goto switchD_001d19fb_caseD_14de;
    case ShaderRecordBufferKHR:
      goto switchD_001d19fb_caseD_14df;
    default:
      if (storage_class == StorageClassTaskPayloadWorkgroupEXT) goto LAB_001d1c07;
      if (storage_class == IncomingCallableDataKHR) {
LAB_001d1c6a:
        VkErrorID_abi_cxx11_(&errorVUID,this,0x1261,in_RCX);
        pFVar2 = function(this,consumer->function_->id_);
        std::__cxx11::string::string((string *)&local_198,(string *)&errorVUID);
        local_d8._8_8_ = 0;
        local_d8._M_unused._M_object = operator_new(0x20);
        *(code **)local_d8._M_unused._0_8_ = (code *)((long)local_d8._M_unused._0_8_ + 0x10);
        if (local_198 == &local_188) {
          *(long *)((long)local_d8._M_unused._0_8_ + 0x10) = CONCAT71(uStack_187,local_188);
          *(long *)((long)local_d8._M_unused._0_8_ + 0x18) = lStack_180;
        }
        else {
          *(undefined1 **)local_d8._M_unused._0_8_ = local_198;
          *(long *)((long)local_d8._M_unused._0_8_ + 0x10) = CONCAT71(uStack_187,local_188);
        }
        *(long *)((long)local_d8._M_unused._0_8_ + 8) = local_190;
        local_190 = 0;
        local_188 = 0;
        local_c0 = std::
                   _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:707:13)>
                   ::_M_invoke;
        local_c8 = std::
                   _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:707:13)>
                   ::_M_manager;
        local_198 = &local_188;
        std::__cxx11::
        list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
        ::push_back(&pFVar2->execution_model_limitations_,(value_type *)&local_d8);
        if (local_c8 != (code *)0x0) {
          p_Var5 = &local_d8;
          pcVar3 = local_c8;
          goto LAB_001d2082;
        }
        goto LAB_001d208a;
      }
      if (storage_class != HitObjectAttributeNV) {
        if (storage_class != CallableDataKHR) {
          return;
        }
        goto LAB_001d196f;
      }
LAB_001d1baf:
      pFVar2 = function(this,consumer->function_->id_);
      local_58._M_unused._M_object = (void *)0x0;
      local_58._8_8_ = 0;
      local_40 = std::
                 _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:813:44)>
                 ::_M_invoke;
      local_48 = std::
                 _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:813:44)>
                 ::_M_manager;
      std::__cxx11::
      list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
      ::push_back(&pFVar2->execution_model_limitations_,(value_type *)&local_58);
      if (local_48 == (code *)0x0) {
        return;
      }
      p_Var5 = &local_58;
      pcVar3 = local_48;
LAB_001d1c5d:
      (*pcVar3)(p_Var5,p_Var5,__destroy_functor);
      goto switchD_001d19fb_caseD_14dc;
    }
  }
  puVar4 = &switchD_001d19fb::switchdataD_0036de94;
  switch(storage_class) {
  case RayPayloadKHR:
    goto switchD_001d19fb_caseD_14da;
  case HitAttributeKHR:
switchD_001d19fb_caseD_14db:
    VkErrorID_abi_cxx11_(&errorVUID,this,0x125d,(char *)puVar4);
    pFVar2 = function(this,consumer->function_->id_);
    std::__cxx11::string::string((string *)&local_198,(string *)&errorVUID);
    local_118._8_8_ = 0;
    local_118._M_unused._M_object = operator_new(0x20);
    *(code **)local_118._M_unused._0_8_ = (code *)((long)local_118._M_unused._0_8_ + 0x10);
    if (local_198 == &local_188) {
      *(long *)((long)local_118._M_unused._0_8_ + 0x10) = CONCAT71(uStack_187,local_188);
      *(long *)((long)local_118._M_unused._0_8_ + 0x18) = lStack_180;
    }
    else {
      *(undefined1 **)local_118._M_unused._0_8_ = local_198;
      *(long *)((long)local_118._M_unused._0_8_ + 0x10) = CONCAT71(uStack_187,local_188);
    }
    *(long *)((long)local_118._M_unused._0_8_ + 8) = local_190;
    local_190 = 0;
    local_188 = 0;
    local_100 = std::
                _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:742:13)>
                ::_M_invoke;
    local_108 = std::
                _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:742:13)>
                ::_M_manager;
    local_198 = &local_188;
    std::__cxx11::
    list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
    ::push_back(&pFVar2->execution_model_limitations_,(value_type *)&local_118);
    if (local_108 == (code *)0x0) break;
    p_Var5 = &local_118;
    pcVar3 = local_108;
    goto LAB_001d2082;
  case CallableDataKHR|StorageBuffer:
  case CallableDataKHR|StorageBuffer|Input:
    goto switchD_001d19fb_caseD_14dc;
  case IncomingRayPayloadKHR:
switchD_001d19fb_caseD_14de:
    VkErrorID_abi_cxx11_(&errorVUID,this,0x125b,(char *)puVar4);
    pFVar2 = function(this,consumer->function_->id_);
    std::__cxx11::string::string((string *)&local_198,(string *)&errorVUID);
    local_138._8_8_ = 0;
    local_138._M_unused._M_object = operator_new(0x20);
    *(code **)local_138._M_unused._0_8_ = (code *)((long)local_138._M_unused._0_8_ + 0x10);
    if (local_198 == &local_188) {
      *(long *)((long)local_138._M_unused._0_8_ + 0x10) = CONCAT71(uStack_187,local_188);
      *(long *)((long)local_138._M_unused._0_8_ + 0x18) = lStack_180;
    }
    else {
      *(undefined1 **)local_138._M_unused._0_8_ = local_198;
      *(long *)((long)local_138._M_unused._0_8_ + 0x10) = CONCAT71(uStack_187,local_188);
    }
    *(long *)((long)local_138._M_unused._0_8_ + 8) = local_190;
    local_190 = 0;
    local_188 = 0;
    local_120 = std::
                _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:760:13)>
                ::_M_invoke;
    local_128 = std::
                _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:760:13)>
                ::_M_manager;
    local_198 = &local_188;
    std::__cxx11::
    list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
    ::push_back(&pFVar2->execution_model_limitations_,(value_type *)&local_138);
    if (local_128 != (code *)0x0) {
      p_Var5 = &local_138;
      pcVar3 = local_128;
      goto LAB_001d2082;
    }
    break;
  case ShaderRecordBufferKHR:
switchD_001d19fb_caseD_14df:
    VkErrorID_abi_cxx11_(&errorVUID,this,0x1bcf,(char *)puVar4);
    pFVar2 = function(this,consumer->function_->id_);
    std::__cxx11::string::string((string *)&local_198,(string *)&errorVUID);
    local_158._8_8_ = 0;
    local_158._M_unused._M_object = operator_new(0x20);
    *(code **)local_158._M_unused._0_8_ = (code *)((long)local_158._M_unused._0_8_ + 0x10);
    if (local_198 == &local_188) {
      *(long *)((long)local_158._M_unused._0_8_ + 0x10) = CONCAT71(uStack_187,local_188);
      *(long *)((long)local_158._M_unused._0_8_ + 0x18) = lStack_180;
    }
    else {
      *(undefined1 **)local_158._M_unused._0_8_ = local_198;
      *(long *)((long)local_158._M_unused._0_8_ + 0x10) = CONCAT71(uStack_187,local_188);
    }
    *(long *)((long)local_158._M_unused._0_8_ + 8) = local_190;
    local_190 = 0;
    local_188 = 0;
    local_140 = std::
                _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:778:13)>
                ::_M_invoke;
    local_148 = std::
                _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:778:13)>
                ::_M_manager;
    local_198 = &local_188;
    std::__cxx11::
    list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
    ::push_back(&pFVar2->execution_model_limitations_,(value_type *)&local_158);
    if (local_148 != (code *)0x0) {
      p_Var5 = &local_158;
      pcVar3 = local_148;
      goto LAB_001d2082;
    }
    break;
  default:
    if (storage_class == StorageClassTaskPayloadWorkgroupEXT) {
LAB_001d1c07:
      pFVar2 = function(this,consumer->function_->id_);
      local_38._M_unused._M_object = (void *)0x0;
      local_38._8_8_ = 0;
      local_20 = std::
                 _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:799:13)>
                 ::_M_invoke;
      local_28 = std::
                 _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:799:13)>
                 ::_M_manager;
      std::__cxx11::
      list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
      ::push_back(&pFVar2->execution_model_limitations_,(value_type *)&local_38);
      if (local_28 == (code *)0x0) {
        return;
      }
      p_Var5 = &local_38;
      pcVar3 = local_28;
      goto LAB_001d1c5d;
    }
    if (storage_class == StorageClassWorkgroup) {
      VkErrorID_abi_cxx11_(&errorVUID,this,0x1225,in_RCX);
      pFVar2 = function(this,consumer->function_->id_);
      std::__cxx11::string::string((string *)&local_198,(string *)&errorVUID);
      local_98._8_8_ = 0;
      local_98._M_unused._M_object = operator_new(0x20);
      *(code **)local_98._M_unused._0_8_ = (code *)((long)local_98._M_unused._0_8_ + 0x10);
      if (local_198 == &local_188) {
        *(long *)((long)local_98._M_unused._0_8_ + 0x10) = CONCAT71(uStack_187,local_188);
        *(long *)((long)local_98._M_unused._0_8_ + 0x18) = lStack_180;
      }
      else {
        *(undefined1 **)local_98._M_unused._0_8_ = local_198;
        *(long *)((long)local_98._M_unused._0_8_ + 0x10) = CONCAT71(uStack_187,local_188);
      }
      *(long *)((long)local_98._M_unused._0_8_ + 8) = local_190;
      local_190 = 0;
      local_188 = 0;
      local_80 = std::
                 _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:662:46)>
                 ::_M_invoke;
      local_88 = std::
                 _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:662:46)>
                 ::_M_manager;
      local_198 = &local_188;
      std::__cxx11::
      list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
      ::push_back(&pFVar2->execution_model_limitations_,(value_type *)&local_98);
      if (local_88 != (code *)0x0) {
        p_Var5 = &local_98;
        pcVar3 = local_88;
        goto LAB_001d2082;
      }
    }
    else if (storage_class == CallableDataKHR) {
LAB_001d196f:
      VkErrorID_abi_cxx11_(&errorVUID,this,0x1260,in_RCX);
      pFVar2 = function(this,consumer->function_->id_);
      std::__cxx11::string::string((string *)&local_198,(string *)&errorVUID);
      local_b8._8_8_ = 0;
      local_b8._M_unused._M_object = operator_new(0x20);
      *(code **)local_b8._M_unused._0_8_ = (code *)((long)local_b8._M_unused._0_8_ + 0x10);
      if (local_198 == &local_188) {
        *(long *)((long)local_b8._M_unused._0_8_ + 0x10) = CONCAT71(uStack_187,local_188);
        *(long *)((long)local_b8._M_unused._0_8_ + 0x18) = lStack_180;
      }
      else {
        *(undefined1 **)local_b8._M_unused._0_8_ = local_198;
        *(long *)((long)local_b8._M_unused._0_8_ + 0x10) = CONCAT71(uStack_187,local_188);
      }
      *(long *)((long)local_b8._M_unused._0_8_ + 8) = local_190;
      local_190 = 0;
      local_188 = 0;
      local_a0 = std::
                 _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:687:13)>
                 ::_M_invoke;
      local_a8 = std::
                 _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:687:13)>
                 ::_M_manager;
      local_198 = &local_188;
      std::__cxx11::
      list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
      ::push_back(&pFVar2->execution_model_limitations_,(value_type *)&local_b8);
      if (local_a8 != (code *)0x0) {
        p_Var5 = &local_b8;
        pcVar3 = local_a8;
        goto LAB_001d2082;
      }
    }
    else {
      if (storage_class == IncomingCallableDataKHR) goto LAB_001d1c6a;
      if (storage_class == HitObjectAttributeNV) goto LAB_001d1baf;
      if (storage_class != Output) {
        return;
      }
      VkErrorID_abi_cxx11_(&errorVUID,this,0x1224,in_RCX);
      pFVar2 = function(this,consumer->function_->id_);
      std::__cxx11::string::string((string *)&local_198,(string *)&errorVUID);
      local_78._8_8_ = 0;
      local_78._M_unused._M_object = operator_new(0x20);
      *(code **)local_78._M_unused._0_8_ = (code *)((long)local_78._M_unused._0_8_ + 0x10);
      if (local_198 == &local_188) {
        *(long *)((long)local_78._M_unused._0_8_ + 0x10) = CONCAT71(uStack_187,local_188);
        *(long *)((long)local_78._M_unused._0_8_ + 0x18) = lStack_180;
      }
      else {
        *(undefined1 **)local_78._M_unused._0_8_ = local_198;
        *(long *)((long)local_78._M_unused._0_8_ + 0x10) = CONCAT71(uStack_187,local_188);
      }
      *(long *)((long)local_78._M_unused._0_8_ + 8) = local_190;
      local_190 = 0;
      local_188 = 0;
      local_60 = std::
                 _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:635:46)>
                 ::_M_invoke;
      local_68 = std::
                 _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:635:46)>
                 ::_M_manager;
      local_198 = &local_188;
      std::__cxx11::
      list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
      ::push_back(&pFVar2->execution_model_limitations_,(value_type *)&local_78);
      if (local_68 != (code *)0x0) {
        p_Var5 = &local_78;
        pcVar3 = local_68;
        goto LAB_001d2082;
      }
    }
  }
  goto LAB_001d208a;
switchD_001d19fb_caseD_14da:
  VkErrorID_abi_cxx11_(&errorVUID,this,0x125a,(char *)puVar4);
  pFVar2 = function(this,consumer->function_->id_);
  std::__cxx11::string::string((string *)&local_198,(string *)&errorVUID);
  local_f8._8_8_ = 0;
  local_f8._M_unused._M_object = operator_new(0x20);
  *(code **)local_f8._M_unused._0_8_ = (code *)((long)local_f8._M_unused._0_8_ + 0x10);
  if (local_198 == &local_188) {
    *(long *)((long)local_f8._M_unused._0_8_ + 0x10) = CONCAT71(uStack_187,local_188);
    *(long *)((long)local_f8._M_unused._0_8_ + 0x18) = lStack_180;
  }
  else {
    *(undefined1 **)local_f8._M_unused._0_8_ = local_198;
    *(long *)((long)local_f8._M_unused._0_8_ + 0x10) = CONCAT71(uStack_187,local_188);
  }
  *(long *)((long)local_f8._M_unused._0_8_ + 8) = local_190;
  local_190 = 0;
  local_188 = 0;
  local_e0 = std::
             _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:722:44)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:722:44)>
             ::_M_manager;
  local_198 = &local_188;
  std::__cxx11::
  list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
  ::push_back(&pFVar2->execution_model_limitations_,(value_type *)&local_f8);
  if (local_e8 != (code *)0x0) {
    p_Var5 = &local_f8;
    pcVar3 = local_e8;
LAB_001d2082:
    (*pcVar3)(p_Var5,p_Var5,__destroy_functor);
  }
LAB_001d208a:
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
switchD_001d19fb_caseD_14dc:
  return;
}

Assistant:

void ValidationState_t::RegisterStorageClassConsumer(
    spv::StorageClass storage_class, Instruction* consumer) {
  if (spvIsVulkanEnv(context()->target_env)) {
    if (storage_class == spv::StorageClass::Output) {
      std::string errorVUID = VkErrorID(4644);
      function(consumer->function()->id())
          ->RegisterExecutionModelLimitation([errorVUID](
                                                 spv::ExecutionModel model,
                                                 std::string* message) {
            if (model == spv::ExecutionModel::GLCompute ||
                model == spv::ExecutionModel::RayGenerationKHR ||
                model == spv::ExecutionModel::IntersectionKHR ||
                model == spv::ExecutionModel::AnyHitKHR ||
                model == spv::ExecutionModel::ClosestHitKHR ||
                model == spv::ExecutionModel::MissKHR ||
                model == spv::ExecutionModel::CallableKHR) {
              if (message) {
                *message =
                    errorVUID +
                    "in Vulkan environment, Output Storage Class must not be "
                    "used in GLCompute, RayGenerationKHR, IntersectionKHR, "
                    "AnyHitKHR, ClosestHitKHR, MissKHR, or CallableKHR "
                    "execution models";
              }
              return false;
            }
            return true;
          });
    }

    if (storage_class == spv::StorageClass::Workgroup) {
      std::string errorVUID = VkErrorID(4645);
      function(consumer->function()->id())
          ->RegisterExecutionModelLimitation([errorVUID](
                                                 spv::ExecutionModel model,
                                                 std::string* message) {
            if (model != spv::ExecutionModel::GLCompute &&
                model != spv::ExecutionModel::TaskNV &&
                model != spv::ExecutionModel::MeshNV &&
                model != spv::ExecutionModel::TaskEXT &&
                model != spv::ExecutionModel::MeshEXT) {
              if (message) {
                *message =
                    errorVUID +
                    "in Vulkan environment, Workgroup Storage Class is limited "
                    "to MeshNV, TaskNV, and GLCompute execution model";
              }
              return false;
            }
            return true;
          });
    }
  }

  if (storage_class == spv::StorageClass::CallableDataKHR) {
    std::string errorVUID = VkErrorID(4704);
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation(
            [errorVUID](spv::ExecutionModel model, std::string* message) {
              if (model != spv::ExecutionModel::RayGenerationKHR &&
                  model != spv::ExecutionModel::ClosestHitKHR &&
                  model != spv::ExecutionModel::CallableKHR &&
                  model != spv::ExecutionModel::MissKHR) {
                if (message) {
                  *message =
                      errorVUID +
                      "CallableDataKHR Storage Class is limited to "
                      "RayGenerationKHR, ClosestHitKHR, CallableKHR, and "
                      "MissKHR execution model";
                }
                return false;
              }
              return true;
            });
  } else if (storage_class == spv::StorageClass::IncomingCallableDataKHR) {
    std::string errorVUID = VkErrorID(4705);
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation(
            [errorVUID](spv::ExecutionModel model, std::string* message) {
              if (model != spv::ExecutionModel::CallableKHR) {
                if (message) {
                  *message =
                      errorVUID +
                      "IncomingCallableDataKHR Storage Class is limited to "
                      "CallableKHR execution model";
                }
                return false;
              }
              return true;
            });
  } else if (storage_class == spv::StorageClass::RayPayloadKHR) {
    std::string errorVUID = VkErrorID(4698);
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation([errorVUID](
                                               spv::ExecutionModel model,
                                               std::string* message) {
          if (model != spv::ExecutionModel::RayGenerationKHR &&
              model != spv::ExecutionModel::ClosestHitKHR &&
              model != spv::ExecutionModel::MissKHR) {
            if (message) {
              *message =
                  errorVUID +
                  "RayPayloadKHR Storage Class is limited to RayGenerationKHR, "
                  "ClosestHitKHR, and MissKHR execution model";
            }
            return false;
          }
          return true;
        });
  } else if (storage_class == spv::StorageClass::HitAttributeKHR) {
    std::string errorVUID = VkErrorID(4701);
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation(
            [errorVUID](spv::ExecutionModel model, std::string* message) {
              if (model != spv::ExecutionModel::IntersectionKHR &&
                  model != spv::ExecutionModel::AnyHitKHR &&
                  model != spv::ExecutionModel::ClosestHitKHR) {
                if (message) {
                  *message = errorVUID +
                             "HitAttributeKHR Storage Class is limited to "
                             "IntersectionKHR, AnyHitKHR, sand ClosestHitKHR "
                             "execution model";
                }
                return false;
              }
              return true;
            });
  } else if (storage_class == spv::StorageClass::IncomingRayPayloadKHR) {
    std::string errorVUID = VkErrorID(4699);
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation(
            [errorVUID](spv::ExecutionModel model, std::string* message) {
              if (model != spv::ExecutionModel::AnyHitKHR &&
                  model != spv::ExecutionModel::ClosestHitKHR &&
                  model != spv::ExecutionModel::MissKHR) {
                if (message) {
                  *message =
                      errorVUID +
                      "IncomingRayPayloadKHR Storage Class is limited to "
                      "AnyHitKHR, ClosestHitKHR, and MissKHR execution model";
                }
                return false;
              }
              return true;
            });
  } else if (storage_class == spv::StorageClass::ShaderRecordBufferKHR) {
    std::string errorVUID = VkErrorID(7119);
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation(
            [errorVUID](spv::ExecutionModel model, std::string* message) {
              if (model != spv::ExecutionModel::RayGenerationKHR &&
                  model != spv::ExecutionModel::IntersectionKHR &&
                  model != spv::ExecutionModel::AnyHitKHR &&
                  model != spv::ExecutionModel::ClosestHitKHR &&
                  model != spv::ExecutionModel::CallableKHR &&
                  model != spv::ExecutionModel::MissKHR) {
                if (message) {
                  *message =
                      errorVUID +
                      "ShaderRecordBufferKHR Storage Class is limited to "
                      "RayGenerationKHR, IntersectionKHR, AnyHitKHR, "
                      "ClosestHitKHR, CallableKHR, and MissKHR execution model";
                }
                return false;
              }
              return true;
            });
  } else if (storage_class == spv::StorageClass::TaskPayloadWorkgroupEXT) {
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation(
            [](spv::ExecutionModel model, std::string* message) {
              if (model != spv::ExecutionModel::TaskEXT &&
                  model != spv::ExecutionModel::MeshEXT) {
                if (message) {
                  *message =
                      "TaskPayloadWorkgroupEXT Storage Class is limited to "
                      "TaskEXT and MeshKHR execution model";
                }
                return false;
              }
              return true;
            });
  } else if (storage_class == spv::StorageClass::HitObjectAttributeNV) {
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation([](spv::ExecutionModel model,
                                              std::string* message) {
          if (model != spv::ExecutionModel::RayGenerationKHR &&
              model != spv::ExecutionModel::ClosestHitKHR &&
              model != spv::ExecutionModel::MissKHR) {
            if (message) {
              *message =
                  "HitObjectAttributeNV Storage Class is limited to "
                  "RayGenerationKHR, ClosestHitKHR or MissKHR execution model";
            }
            return false;
          }
          return true;
        });
  }
}